

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O2

void rd_pick_rect_partition
               (AV1_COMP *cpi,TileDataEnc *tile_data,MACROBLOCK *x,
               PICK_MODE_CONTEXT *cur_partition_ctx,PartitionSearchState *part_search_state,
               RD_STATS *best_rdc,int idx,int mi_row,int mi_col,BLOCK_SIZE bsize,
               PARTITION_TYPE partition_type)

{
  int64_t *piVar1;
  int iVar2;
  RD_STATS best_rd;
  RD_STATS best_remain_rdcost;
  RD_STATS local_58;
  
  av1_rd_stats_subtraction(x->rdmult,best_rdc,&part_search_state->sum_rdc,&local_58);
  best_rd.dist = local_58.dist;
  best_rd.rate = local_58.rate;
  best_rd.zero_rate = local_58.zero_rate;
  best_rd.rdcost = local_58.rdcost;
  best_rd.sse = local_58.sse;
  best_rd.skip_txfm = local_58.skip_txfm;
  best_rd._33_7_ = local_58._33_7_;
  pick_sb_modes(cpi,tile_data,x,mi_row,mi_col,&part_search_state->this_rdc,partition_type,bsize,
                cur_partition_ctx,best_rd);
  av1_rd_cost_update(x->rdmult,&part_search_state->this_rdc);
  iVar2 = (part_search_state->this_rdc).rate;
  if (iVar2 == 0x7fffffff) {
    (part_search_state->sum_rdc).rdcost = 0x7fffffffffffffff;
  }
  else {
    (part_search_state->sum_rdc).rate = (part_search_state->sum_rdc).rate + iVar2;
    piVar1 = &(part_search_state->sum_rdc).dist;
    *piVar1 = *piVar1 + (part_search_state->this_rdc).dist;
    av1_rd_cost_update(x->rdmult,&part_search_state->sum_rdc);
  }
  part_search_state->rect_part_rd[partition_type != '\x01'][(uint)idx] =
       (part_search_state->this_rdc).rdcost;
  return;
}

Assistant:

static void rd_pick_rect_partition(AV1_COMP *const cpi, TileDataEnc *tile_data,
                                   MACROBLOCK *x,
                                   PICK_MODE_CONTEXT *cur_partition_ctx,
                                   PartitionSearchState *part_search_state,
                                   RD_STATS *best_rdc, const int idx,
                                   int mi_row, int mi_col, BLOCK_SIZE bsize,
                                   PARTITION_TYPE partition_type) {
  // Obtain the remainder from the best rd cost
  // for further processing of partition.
  RD_STATS best_remain_rdcost;
  av1_rd_stats_subtraction(x->rdmult, best_rdc, &part_search_state->sum_rdc,
                           &best_remain_rdcost);

  // Obtain the best mode for the partition sub-block.
  pick_sb_modes(cpi, tile_data, x, mi_row, mi_col, &part_search_state->this_rdc,
                partition_type, bsize, cur_partition_ctx, best_remain_rdcost);
  av1_rd_cost_update(x->rdmult, &part_search_state->this_rdc);

  // Update the partition rd cost with the current sub-block rd.
  if (part_search_state->this_rdc.rate == INT_MAX) {
    part_search_state->sum_rdc.rdcost = INT64_MAX;
  } else {
    part_search_state->sum_rdc.rate += part_search_state->this_rdc.rate;
    part_search_state->sum_rdc.dist += part_search_state->this_rdc.dist;
    av1_rd_cost_update(x->rdmult, &part_search_state->sum_rdc);
  }
  const RECT_PART_TYPE rect_part =
      partition_type == PARTITION_HORZ ? HORZ : VERT;
  part_search_state->rect_part_rd[rect_part][idx] =
      part_search_state->this_rdc.rdcost;
}